

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_ComputeSolutions(ARKodeMem ark_mem,realtype *dsmPtr)

{
  void *pvVar1;
  N_Vector z;
  N_Vector z_00;
  realtype *c;
  N_Vector *X;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  realtype rVar6;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","arkStep_ComputeSolutions",
                    "Time step module memory is NULL.");
    iVar5 = -0x15;
  }
  else {
    z = ark_mem->ycur;
    z_00 = ark_mem->tempv1;
    c = *(realtype **)((long)pvVar1 + 0x198);
    X = *(N_Vector **)((long)pvVar1 + 0x1a0);
    *dsmPtr = 0.0;
    *c = 1.0;
    *X = ark_mem->yn;
    uVar4 = 0;
    uVar3 = (ulong)*(uint *)((long)pvVar1 + 0x5c);
    if ((int)*(uint *)((long)pvVar1 + 0x5c) < 1) {
      uVar3 = uVar4;
    }
    iVar5 = 1;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      if (*(int *)((long)pvVar1 + 0x18) != 0) {
        c[iVar5] = ark_mem->h *
                   *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x60) + 0x20) + uVar4 * 8);
        X[iVar5] = *(N_Vector *)(*(long *)((long)pvVar1 + 0x28) + uVar4 * 8);
        iVar5 = iVar5 + 1;
      }
      if (*(int *)((long)pvVar1 + 0x1c) != 0) {
        c[iVar5] = ark_mem->h *
                   *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x68) + 0x20) + uVar4 * 8);
        X[iVar5] = *(N_Vector *)(*(long *)((long)pvVar1 + 0x30) + uVar4 * 8);
        iVar5 = iVar5 + 1;
      }
    }
    iVar2 = N_VLinearCombination(iVar5,c,X,z);
    iVar5 = -0x1c;
    if ((iVar2 == 0) && (iVar5 = 0, ark_mem->fixedstep == 0)) {
      uVar4 = 0;
      uVar3 = (ulong)*(uint *)((long)pvVar1 + 0x5c);
      if ((int)*(uint *)((long)pvVar1 + 0x5c) < 1) {
        uVar3 = uVar4;
      }
      iVar5 = 0;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        if (*(int *)((long)pvVar1 + 0x18) != 0) {
          c[iVar5] = (*(double *)(*(long *)(*(long *)((long)pvVar1 + 0x60) + 0x20) + uVar4 * 8) -
                     *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x60) + 0x28) + uVar4 * 8)) *
                     ark_mem->h;
          X[iVar5] = *(N_Vector *)(*(long *)((long)pvVar1 + 0x28) + uVar4 * 8);
          iVar5 = iVar5 + 1;
        }
        if (*(int *)((long)pvVar1 + 0x1c) != 0) {
          c[iVar5] = (*(double *)(*(long *)(*(long *)((long)pvVar1 + 0x68) + 0x20) + uVar4 * 8) -
                     *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x68) + 0x28) + uVar4 * 8)) *
                     ark_mem->h;
          X[iVar5] = *(N_Vector *)(*(long *)((long)pvVar1 + 0x30) + uVar4 * 8);
          iVar5 = iVar5 + 1;
        }
      }
      iVar2 = N_VLinearCombination(iVar5,c,X,z_00);
      iVar5 = -0x1c;
      if (iVar2 == 0) {
        rVar6 = N_VWrmsNorm(z_00,ark_mem->ewt);
        *dsmPtr = rVar6;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int arkStep_ComputeSolutions(ARKodeMem ark_mem, realtype *dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_ComputeSolutions", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* set N_Vector shortcuts, and shortcut to time at end of step */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  cvals[0] = ONE;
  Xvecs[0] = ark_mem->yn;
  nvec = 1;
  for (j=0; j<step_mem->stages; j++) {
    if (step_mem->explicit) {      /* Explicit pieces */
      cvals[nvec] = ark_mem->h * step_mem->Be->b[j];
      Xvecs[nvec] = step_mem->Fe[j];
      nvec += 1;
    }
    if (step_mem->implicit) {      /* Implicit pieces */
      cvals[nvec] = ark_mem->h * step_mem->Bi->b[j];
      Xvecs[nvec] = step_mem->Fi[j];
      nvec += 1;
    }
  }

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep) {

    /* set arrays for fused vector operation */
    nvec = 0;
    for (j=0; j<step_mem->stages; j++) {
      if (step_mem->explicit) {        /* Explicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Be->b[j] - step_mem->Be->d[j]);
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit) {        /* Implicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Bi->b[j] - step_mem->Bi->d[j]);
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return(ARK_SUCCESS);
}